

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

StringResultCode
QCborStreamReaderPrivate::appendStringChunk(QCborStreamReader *reader,QByteArray *data)

{
  ReadStringChunk params;
  Code CVar1;
  pointer this;
  StringResultCode SVar2;
  QCborStreamReader *in_RSI;
  long in_FS_OFFSET;
  bool bVar3;
  StringResult<long_long> SVar4;
  StringResultCode status;
  qsizetype in_stack_00000028;
  Code local_3c;
  longlong local_38;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ReadStringChunk local_28;
  longlong local_18;
  StringResultCode local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = std::unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>::
         operator->((unique_ptr<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                     *)0x8d9e8e);
  ReadStringChunk::ReadStringChunk(&local_28,(QByteArray *)in_RSI,ByteArray);
  params.maxlen_or_type = in_stack_00000028;
  params.field_0.array = (QByteArray *)reader;
  SVar4 = readStringChunk((QCborStreamReaderPrivate *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),params);
  local_38 = SVar4.data;
  SVar2 = SVar4.status;
  bVar3 = false;
  local_18 = local_38;
  local_10 = SVar2;
  if (SVar2 == EndOfString) {
    local_3c = (Code)QCborStreamReader::lastError((QCborStreamReader *)this);
    CVar1 = QCborError::operator_cast_to_Code((QCborError *)&local_3c);
    bVar3 = CVar1 == NoError;
  }
  if (bVar3) {
    QCborStreamReader::preparse(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return SVar2;
}

Assistant:

inline QCborStreamReader::StringResultCode
QCborStreamReaderPrivate::appendStringChunk(QCborStreamReader &reader, QByteArray *data)
{
    auto status = reader.d->readStringChunk(data).status;
    if (status == QCborStreamReader::EndOfString && reader.lastError() == QCborError::NoError)
        reader.preparse();
    return status;
}